

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

bool __thiscall QAccessibleTable::isSelected(QAccessibleTable *this,QAccessibleInterface *childCell)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  long *plVar3;
  
  if ((childCell != (QAccessibleInterface *)0x0) &&
     (puVar2 = (undefined1 *)(**(code **)(*(long *)childCell + 0x40))(childCell),
     (QAccessibleObject *)puVar2 == &this->super_QAccessibleObject)) {
    plVar3 = (long *)(**(code **)(*(long *)childCell + 0xa0))(childCell,6);
    if (plVar3 == (long *)0x0) {
      return false;
    }
    uVar1 = (**(code **)(*plVar3 + 0x10))(plVar3);
    return (bool)uVar1;
  }
  isSelected();
  return false;
}

Assistant:

bool QAccessibleTable::isSelected(QAccessibleInterface *childCell) const
{
    if (!childCell || childCell->parent() != this) {
        qWarning() << "QAccessibleTable::isSelected: Accessible interface must be a direct child of the table interface.";
        return false;
    }

    const QAccessibleTableCellInterface *cell = childCell->tableCellInterface();
    if (cell)
        return cell->isSelected();

    return false;
}